

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O3

void __thiscall
TPZFMatrix<std::complex<float>_>::TPZFMatrix
          (TPZFMatrix<std::complex<float>_> *this,initializer_list<std::complex<float>_> *list)

{
  iterator pcVar1;
  complex<float> *__s;
  ulong __n;
  ulong uVar2;
  
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow = list->_M_len;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = 1;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181dee0;
  TPZVec<int>::TPZVec(&(this->fPivot).super_TPZVec<int>,0);
  (this->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  (this->fPivot).super_TPZVec<int>.fStore = (this->fPivot).fExtAlloc;
  (this->fPivot).super_TPZVec<int>.fNElements = 0;
  (this->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
  (this->fWork).fStore = (complex<float> *)0x0;
  (this->fWork).fNElements = 0;
  (this->fWork).fNAlloc = 0;
  uVar2 = list->_M_len;
  if (uVar2 != 0) {
    __n = uVar2 << 3;
    __s = (complex<float> *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | __n);
    uVar2 = 0;
    memset(__s,0,__n);
    this->fElem = __s;
    pcVar1 = list->_M_array;
    do {
      *(undefined8 *)((long)&__s->_M_value + uVar2) =
           *(undefined8 *)((long)&pcVar1->_M_value + uVar2);
      uVar2 = uVar2 + 8;
    } while (__n != uVar2);
  }
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const std::initializer_list<TVar>& list) 
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId), TPZMatrix<TVar>(list.size(), 1)
{
	if (list.size() > 0) {
		this->fElem = new TVar[list.size()];
	}

	auto it = list.begin();
	auto it_end = list.end();
	TVar* aux = fElem;
	for (; it != it_end; it++, aux++)
		*aux = *it;
}